

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnintf.c
# Opt level: O0

UINT8 device_start_ym2203(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DATA *devData_00;
  undefined8 *param;
  void *pvVar1;
  UINT32 local_2c;
  UINT32 rate;
  DEV_DATA *devData;
  OPN_INF *info;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  local_2c = cfg->clock / 0x48;
  if ((cfg->srMode == '\x01') || ((cfg->srMode == '\x02' && (local_2c < cfg->smplRate)))) {
    local_2c = cfg->smplRate;
  }
  param = (undefined8 *)malloc(0x10);
  param[1] = 0;
  pvVar1 = ym2203_init(param,cfg->clock,local_2c,(FM_TIMERHANDLER)0x0,(FM_IRQHANDLER)0x0);
  *param = pvVar1;
  devData_00 = (DEV_DATA *)*param;
  devData_00->chipInf = param;
  INIT_DEVINF(retDevInf,devData_00,local_2c,&devDef_MAME_2203);
  init_ssg_devinfo(retDevInf,cfg,'\x01',' ');
  return '\0';
}

Assistant:

static UINT8 device_start_ym2203(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	OPN_INF* info;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 72;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	info = (OPN_INF*)malloc(sizeof(OPN_INF));
	info->ssg = NULL;
	info->opn = ym2203_init(info, cfg->clock, rate, NULL, NULL);
	
	devData = (DEV_DATA*)info->opn;
	devData->chipInf = info;	// store pointer to OPN_INF into sound chip structure
	INIT_DEVINF(retDevInf, devData, rate, &devDef_MAME_2203);
	init_ssg_devinfo(retDevInf, cfg, 1, AYTYPE_YM2203);
	return 0x00;
}